

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ds_stack.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/ccicc[P]DeepSea/tests/test_ds_stack.c"
            );
  UnityDefaultTestRun(test_dsStack_counts,"test_dsStack_counts",0x4b);
  UnityDefaultTestRun(test_dsStack_overflow,"test_dsStack_overflow",0x4c);
  UnityDefaultTestRun(test_dsStack_empty,"test_dsStack_empty",0x4d);
  UnityDefaultTestRun(test_dsStack_store,"test_dsStack_store",0x4e);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    UNITY_BEGIN();
    RUN_TEST(test_dsStack_counts);
    RUN_TEST(test_dsStack_overflow);
    RUN_TEST(test_dsStack_empty);
    RUN_TEST(test_dsStack_store);
    return UNITY_END();
}